

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int callback_cancel(uint id)

{
  callback_t **ppcVar1;
  callback_t *__ptr;
  
  ppcVar1 = &gCallBackFirst;
  __ptr = gCallBackFirst;
  while( true ) {
    if (__ptr == (callback_t *)0x0) {
      return -0x7da;
    }
    if (__ptr->id == id) break;
    __ptr = __ptr->next;
  }
  if (__ptr->prev != (callback_t *)0x0) {
    ppcVar1 = &__ptr->prev->next;
  }
  *ppcVar1 = __ptr->next;
  if (__ptr->next == (callback_t *)0x0) {
    ppcVar1 = &gCallBackLast;
  }
  else {
    ppcVar1 = &__ptr->next->prev;
  }
  *ppcVar1 = __ptr->prev;
  free(__ptr);
  findNotifyBits();
  return 0;
}

Assistant:

int callback_cancel(unsigned id)
{
   callback_t *p;

   p = gCallBackFirst;

   while (p)
   {
      if (p->id == id)
      {
         if (p->prev) p->prev->next = p->next;
         else gCallBackFirst = p->next;

         if (p->next) p->next->prev = p->prev;
         else gCallBackLast = p->prev;

         free(p);

         findNotifyBits();

         return 0;
      }
      p = p->next;
   }
   return pigif_callback_not_found;
}